

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O0

void __thiscall
viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *this,size_type num)

{
  size_type __n;
  rt_expr<viennamath::rt_expression_interface<double>> *this_00;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> local_48;
  ulong local_38;
  size_t i;
  allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_> local_19;
  size_type local_18;
  size_type num_local;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_18 = num;
  num_local = (size_type)this;
  rt_expression_interface<double>::rt_expression_interface
            (&this->super_rt_expression_interface<double>);
  __n = local_18;
  std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>::allocator
            (&local_19);
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::vector(&this->
            super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ,__n,&local_19);
  std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>::~allocator
            (&local_19);
  (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_vector_expr_00125550;
  for (local_38 = 0; local_38 < local_18; local_38 = local_38 + 1) {
    rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant(&local_48,0.0);
    this_00 = (rt_expr<viennamath::rt_expression_interface<double>> *)
              std::
              vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
              ::operator[](&this->
                            super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                           ,local_38);
    rt_expr<viennamath::rt_expression_interface<double>>::operator=(this_00,&local_48);
    rt_constant<double,_viennamath::rt_expression_interface<double>_>::~rt_constant(&local_48);
  }
  return;
}

Assistant:

explicit rt_vector_expr(size_type num) : BaseType(num)
      {
        //initialize all zeros:
        for (std::size_t i=0; i<num; ++i)
          BaseType::operator[](i) = viennamath::rt_constant<numeric_type, interface_type>(0);
      }